

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_max_uploads(torrent *this,int limit,bool state_update)

{
  uint uVar1;
  uint local_14;
  bool state_update_local;
  int limit_local;
  torrent *this_local;
  
  local_14 = limit;
  if (limit < 1) {
    local_14 = 0xffffff;
  }
  if (*(uint3 *)&this->field_0x5d4 != local_14) {
    if (state_update) {
      state_updated(this);
    }
    uVar1 = numeric_cast<unsigned_int,int,void>(local_14);
    *(short *)&this->field_0x5d4 = (short)uVar1;
    this->field_0x5d6 = (char)(uVar1 >> 0x10);
    uVar1 = (*(this->super_request_callback)._vptr_request_callback[6])();
    if (((uVar1 & 1) != 0) && (state_update)) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** set-max-uploads: %d",(ulong)*(uint3 *)&this->field_0x5d4);
    }
    if (state_update) {
      set_need_save_resume(this,(resume_data_flags_t)0x20);
    }
  }
  return;
}

Assistant:

void torrent::set_max_uploads(int limit, bool const state_update)
	{
		TORRENT_ASSERT(is_single_thread());
		// TODO: perhaps 0 should actually mean 0
		if (limit <= 0) limit = (1 << 24) - 1;
		if (int(m_max_uploads) == limit) return;
		if (state_update) state_updated();
		m_max_uploads = aux::numeric_cast<std::uint32_t>(limit);
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log() && state_update)
			debug_log("*** set-max-uploads: %d", m_max_uploads);
#endif

		if (state_update)
			set_need_save_resume(torrent_handle::if_config_changed);
	}